

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_4.hpp
# Opt level: O1

schema_validator_ptr_type __thiscall
jsoncons::jsonschema::draft4::
schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_schema_validator
          (schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          keys,anchor_uri_map_type *anchor_dict)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  json_type jVar5;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var6;
  object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_01;
  const_iterator cVar7;
  runtime_error *this_02;
  _Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  *p_Var8;
  uri_wrapper *puVar9;
  _Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  _Var10;
  uri_wrapper *uri;
  pointer __args;
  long lVar11;
  byte bVar12;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  undefined1 __args_00 [8];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *__k;
  long *plVar13;
  bool bVar14;
  const_object_iterator cVar15;
  string_view str;
  undefined8 in_stack_00000008;
  string sub_keys [2];
  vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  validators;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> default_value;
  uri relative;
  uri id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  defs;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  undefined1 local_460 [8];
  _Alloc_hider local_458;
  _Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined1 local_408 [24];
  _Invoker_type p_Stack_3f0;
  _Alloc_hider local_3e8;
  size_type sStack_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  unsigned_long local_3c8;
  _Alloc_hider _Stack_3c0;
  pointer local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [2];
  vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  local_378;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_360;
  uri_wrapper *local_358;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_350;
  undefined1 local_340 [8];
  pointer local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [8];
  uri local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  local_220;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 *local_1d0;
  tuple<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  tStack_1c8;
  void *local_1c0;
  size_type sStack_1b8;
  _Manager_type local_1b0;
  _Invoker_type p_Stack_1a8;
  pointer local_1a0;
  size_type sStack_198;
  size_type local_190;
  undefined8 uStack_188;
  unsigned_long local_180;
  pointer pcStack_178;
  pointer local_170;
  size_type sStack_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  local_138;
  void **local_120;
  void *local_110 [16];
  char local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  puVar9 = (uri_wrapper *)keys.data_;
  (**(code **)((context->base_uri_).uri_.uri_string_._M_dataplus._M_p + 0x10))(&local_1f0);
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)0x0;
  jVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     puVar9);
  if (jVar5 == bool_value) {
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_boolean_schema
              ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_438,context,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_1f0.common_);
    uVar2 = local_438._0_8_;
    local_438._0_8_ =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    (this->
    super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    )._vptr_schema_validator_factory_base = (_func_int **)uVar2;
    if (local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __args = local_138.
               super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_438._0_8_ = uVar2;
        std::
        _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>
        ::
        _M_emplace_unique<jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*&>
                  ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>
                    *)(context->base_uri_).identifier_.field_2._M_allocated_capacity,&__args->uri_,
                   (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    **)local_438);
        __args = __args + 1;
      } while (__args != local_138.
                         super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    if (jVar5 != object_value) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x18);
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_base_uri((uri *)local_438,
                     (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)&local_1f0.common_);
      std::operator+(&local_2b0.uri_string_,"invalid JSON-type for a schema for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438)
      ;
      p_Var8 = (_Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
                *)std::__cxx11::string::append((char *)&local_2b0);
      local_340 = (undefined1  [8])p_Var8->_M_head_impl;
      _Var10._M_head_impl =
           (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)(p_Var8 + 2);
      if (local_340 == (undefined1  [8])_Var10._M_head_impl) {
        local_330[0]._0_8_ =
             (_Var10._M_head_impl)->
             super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ;
        local_330[0]._8_8_ = p_Var8[3]._M_head_impl;
        local_340 = (undefined1  [8])local_330;
      }
      else {
        local_330[0]._0_8_ =
             (_Var10._M_head_impl)->
             super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ;
      }
      local_338 = (pointer)p_Var8[1]._M_head_impl;
      p_Var8->_M_head_impl = _Var10._M_head_impl;
      p_Var8[1]._M_head_impl =
           (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      *(undefined1 *)&p_Var8[2]._M_head_impl = 0;
      *(undefined ***)(this_02 + 0x10) = &PTR__json_exception_00b58738;
      std::runtime_error::runtime_error(this_02,(string *)local_340);
      *(undefined8 *)this_02 = 0xb6b4e0;
      *(undefined8 *)(this_02 + 0x10) = 0xb6b518;
      __cxa_throw(this_02,&schema_error::typeinfo,schema_error::~schema_error);
    }
    local_438._0_8_ =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x4;
    local_438._8_8_ = "$ref";
    cVar15 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                              *)puVar9,(string_view_type *)local_438);
    _Var6 = cVar15.it_._M_current;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((const_object_range_type *)local_438,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)puVar9);
    if ((((undefined1  [16])cVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_428[8] & 1) == 0)) {
      bVar14 = cVar15.has_value_ == (bool)local_428[8];
    }
    else {
      bVar14 = _Var6._M_current ==
               (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_428._0_8_;
    }
    if (bVar14) {
      make_object_schema_validator
                ((schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_438,context,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 &local_1f0.common_,(anchor_uri_map_type *)puVar9);
      uVar2 = local_438._0_8_;
      local_438._0_8_ =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      (this->
      super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_schema_validator_factory_base = (_func_int **)uVar2;
    }
    else {
      local_378.
      super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_220._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_220._M_impl.super__Rb_tree_header._M_header;
      local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_438._0_8_ = &DAT_0000000b;
      local_438._8_8_ = "definitions";
      local_220._M_impl.super__Rb_tree_header._M_header._M_right =
           local_220._M_impl.super__Rb_tree_header._M_header._M_left;
      cVar15 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
               find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                *)puVar9,(string_view_type *)local_438);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)local_438,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)puVar9);
      if ((((undefined1  [16])cVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         ((local_428[8] & 1) == 0)) {
        bVar14 = cVar15.has_value_ == (bool)local_428[8];
      }
      else {
        bVar14 = cVar15.it_._M_current._M_current ==
                 (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_428._0_8_;
      }
      if (!bVar14) {
        local_360 = _Var6._M_current;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_340,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &(cVar15.it_._M_current._M_current)->value_);
        local_458._M_p._0_1_ = local_338._0_1_;
        local_448._M_local_buf[0] = local_330[0]._M_local_buf[8];
        local_448._8_8_ = local_330[0]._M_allocated_capacity;
        _Var6._M_current = local_360;
        __args_00 = local_340;
        bVar14 = local_338._0_1_ == (bool)local_330[0]._8_1_;
        if ((local_338._0_1_ & local_330[0]._M_local_buf[8] & 1U) != 0) {
          bVar14 = local_340 == (undefined1  [8])local_330[0]._0_8_;
        }
        while (local_360 = _Var6._M_current, !bVar14) {
          local_438._0_8_ = local_428;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"definitions","");
          local_418._M_allocated_capacity = (size_type)local_408;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_418,*(size_type *)__args_00,
                     *(size_type *)__args_00 + *(size_type *)((long)__args_00 + 8));
          (**(code **)((context->base_uri_).uri_.uri_string_._M_dataplus._M_p + 0x18))
                    (&local_2b0,context,sch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__args_00 + 0x20),(string *)local_438,2,in_stack_00000008);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
                      *)&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_00,
                     (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                      *)&local_2b0);
          if ((long *)local_2b0.uri_string_._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_2b0.uri_string_._M_dataplus._M_p + 8))();
          }
          lVar11 = -0x40;
          plVar13 = (long *)local_408;
          do {
            if (plVar13 != (long *)plVar13[-2]) {
              operator_delete((long *)plVar13[-2],*plVar13 + 1);
            }
            plVar13 = plVar13 + -4;
            lVar11 = lVar11 + 0x20;
          } while (lVar11 != 0);
          __args_00 = (undefined1  [8])((long)__args_00 + 0x30);
          _Var6._M_current = local_360;
          bVar14 = __args_00 == (undefined1  [8])local_448._8_8_;
          if ((local_338._0_1_ & local_330[0]._M_local_buf[8] & 1U) == 0) {
            bVar14 = (char)local_458._M_p == local_448._M_local_buf[0];
          }
        }
      }
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      basic_json<jsoncons::null_type,void>
                ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                 &local_350,(null_type *)local_438);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      as_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                 &(_Var6._M_current)->value_,(allocator<char> *)&local_2b0);
      str._M_str = (char *)local_438._0_8_;
      str._M_len = local_438._8_8_;
      jsoncons::uri::uri((uri *)local_340,str);
      if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_438._0_8_ !=
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      }
      local_438._0_8_ =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_428;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_438,*(long *)&sch->field_0,
                 &(((sch->field_0).long_str_.ptr_)->
                  super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
                 *(long *)&sch->field_0);
      local_418._M_allocated_capacity = *(undefined8 *)&sch[2].field_0;
      local_418._8_8_ = sch[2].field_0.int64_.val_;
      local_408._0_8_ = *(undefined8 *)&sch[3].field_0;
      local_408._8_8_ = sch[3].field_0.int64_.val_;
      local_408._16_8_ = *(undefined8 *)&sch[4].field_0;
      p_Stack_3f0 = (_Invoker_type)sch[4].field_0.int64_.val_;
      local_3e8._M_p = *(pointer *)&sch[5].field_0;
      sStack_3e0 = sch[5].field_0.int64_.val_;
      local_3d8._M_allocated_capacity = *(undefined8 *)&sch[6].field_0;
      local_3d8._8_8_ = sch[6].field_0.int64_.val_;
      local_3c8 = *(unsigned_long *)&sch[7].field_0;
      _Stack_3c0._M_p = (pointer)sch[7].field_0.int64_.val_;
      local_3b8 = *(pointer *)&sch[8].field_0;
      aStack_3b0._M_allocated_capacity = sch[8].field_0.int64_.val_;
      jsoncons::uri::resolve(&local_2b0,(uri *)local_438,(uri *)local_340);
      if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_438._0_8_ !=
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      }
      uri_wrapper::uri_wrapper((uri_wrapper *)local_438,&local_2b0);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::get_or_create_reference
                ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_460,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 context,puVar9);
      local_450._M_head_impl =
           (keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_460;
      local_460 = (undefined1  [8])0x0;
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
      ::
      emplace_back<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                ((vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  *)&local_378,
                 (unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)&local_450);
      if (local_450._M_head_impl !=
          (keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)0x0) {
        (*((local_450._M_head_impl)->
          super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ).super_validation_message_factory._vptr_validation_message_factory[1])();
      }
      local_450._M_head_impl =
           (keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      if (local_460 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_460 + 8))();
      }
      local_460 = (undefined1  [8])0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_3b0._8_8_ != local_398) {
        operator_delete((void *)aStack_3b0._8_8_,(ulong)(local_398[0]._M_allocated_capacity + 1));
      }
      if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_438._0_8_ !=
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      }
      local_438._0_8_ =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_428;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_438,local_1f0._0_8_,
                 &((local_1f0.long_str_.ptr_)->
                  super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
                 local_1f0._0_8_);
      local_418._0_8_ = local_1d0;
      local_418._8_8_ =
           tStack_1c8.
           super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_408._0_8_ = local_1c0;
      local_408._8_8_ = sStack_1b8;
      local_408._16_8_ = local_1b0;
      p_Stack_3f0 = p_Stack_1a8;
      local_3e8._M_p = local_1a0;
      sStack_3e0 = sStack_198;
      local_3d8._M_allocated_capacity = local_190;
      local_3d8._8_8_ = uStack_188;
      local_3c8 = local_180;
      _Stack_3c0._M_p = pcStack_178;
      local_3b8 = local_170;
      aStack_3b0._M_allocated_capacity = sStack_168;
      this_00 = (object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)operator_new(0x278);
      object_schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::object_schema_validator
                (this_00,(uri *)local_438,(optional<jsoncons::uri> *)(sch + 0xd),&local_378,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                  *)&local_220,&local_350);
      pp_Var1 = (this->
                super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                )._vptr_schema_validator_factory_base;
      (this->
      super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_schema_validator_factory_base = (_func_int **)this_00;
      if (pp_Var1 != (_func_int **)0x0) {
        (**(code **)(*pp_Var1 + 8))();
      }
      if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_438._0_8_ !=
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.uri_string_._M_dataplus._M_p != &local_2b0.uri_string_.field_2) {
        operator_delete(local_2b0.uri_string_._M_dataplus._M_p,
                        (ulong)(local_2b0.uri_string_.field_2._M_allocated_capacity + 1));
      }
      if (local_340 != (undefined1  [8])local_330) {
        operator_delete((void *)local_340,(ulong)(local_330[0]._M_allocated_capacity + 1));
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                (&local_350);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_220);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&local_378);
    }
    local_448._8_8_ =
         local_138.
         super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_448._M_allocated_capacity =
           (size_type)
           (this->
           super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           )._vptr_schema_validator_factory_base;
      local_358 = puVar9;
      do {
        puVar9 = local_358;
        local_438._0_8_ = local_448._M_allocated_capacity;
        local_458._M_p =
             (pointer)local_138.
                      super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        std::
        _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>
        ::
        _M_emplace_unique<jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*&>
                  ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>
                    *)(context->base_uri_).identifier_.field_2._M_allocated_capacity,
                   &(local_138.
                     super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                     ._M_impl.super__Vector_impl_data._M_start)->uri_,
                   (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    **)local_438);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_438,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)puVar9
                  );
        uVar4 = local_428[8];
        uVar2 = local_428._0_8_;
        uVar3 = local_438[8];
        bVar12 = local_438[8] & local_428[8];
        __k = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_438._0_8_;
        bVar14 = local_438[8] == local_428[8];
        if ((bVar12 & 1) != 0) {
          bVar14 = local_438._0_8_ == local_428._0_8_;
        }
        while (!bVar14) {
          this_01 = &schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                     ::known_keywords_abi_cxx11_()->_M_h;
          cVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(this_01,&__k->key_);
          schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          ::known_keywords_abi_cxx11_();
          if (cVar7.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::insert_unknown_keyword
                      ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                        *)context,(uri_wrapper *)local_458._M_p,&__k->key_,&__k->value_);
          }
          __k = __k + 1;
          bVar14 = __k == (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                           *)uVar2;
          if ((bVar12 & 1) == 0) {
            bVar14 = uVar3 == uVar4;
          }
        }
        local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)local_458._M_p + 0xb8);
      } while (local_138.
               super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)local_448._8_8_);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  if ((local_90 == '\x01') && (local_90 = '\0', local_120 != local_110)) {
    operator_delete(local_120,(long)local_110[0] + 1);
  }
  std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  ::~vector(&local_138);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != &local_1e0) {
    operator_delete((void *)local_1f0._0_8_,local_1e0._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

schema_validator_ptr_type make_schema_validator( 
            const compilation_context<Json>& context, const Json& sch, jsoncons::span<const std::string> keys, 
            anchor_uri_map_type& anchor_dict) override
        {
            auto new_context = make_compilation_context(context, sch, keys);
            //std::cout << "make_schema_validator " << context.get_base_uri().string() << ", " << new_context.get_base_uri().string() << "\n\n";

            schema_validator_ptr_type schema_validator_ptr;

            switch (sch.type())
            {
                case json_type::bool_value:
                {
                    schema_validator_ptr = this->make_boolean_schema(new_context, sch);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                    }          
                    break;
                }
                case json_type::object_value:
                {
                    auto it = sch.find("$ref");
                    if (it != sch.object_range().end()) // this schema is a reference
                    {
                        std::vector<keyword_validator_ptr_type> validators;
                        std::map<std::string,schema_validator_ptr_type> defs;

                        auto it2 = sch.find("definitions");
                        if (it2 != sch.object_range().end()) 
                        {
                            for (const auto& def : it2->value().object_range())
                            {
                                std::string sub_keys[] = { "definitions", def.key() };
                                defs.emplace(def.key(), make_schema_validator(context, def.value(), sub_keys, anchor_dict));
                            }
                        }

                        Json default_value{ jsoncons::null_type() };
                        uri relative((*it).value().template as<std::string>()); 
                        auto id = context.get_base_uri().resolve(relative);
                        validators.push_back(this->get_or_create_reference(sch, uri_wrapper{id}));
                        schema_validator_ptr = jsoncons::make_unique<object_schema_validator<Json>>(
                            new_context.get_base_uri(), context.id(),
                            std::move(validators), std::move(defs), std::move(default_value));
                    }
                    else
                    {
                        schema_validator_ptr = make_object_schema_validator(new_context, sch, anchor_dict);
                    }
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                        for (const auto& item : sch.object_range())
                        {
                            if (known_keywords().find(item.key()) == known_keywords().end())
                            {
                                this->insert_unknown_keyword(uri, item.key(), item.value()); // save unknown keywords for later reference
                            }
                        }
                    }          
                    break;
                }
                default:
                    JSONCONS_THROW(schema_error("invalid JSON-type for a schema for " + new_context.get_base_uri().string() + ", expected: boolean or object"));
                    break;
            }
            
            return schema_validator_ptr;
        }